

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O1

void PrintExprFuncCall(FLispString *out,ZCC_TreeNode *node)

{
  if (*(int *)&node[1].SiblingNext == 5) {
    FLispString::Open(out,"expr-func-call");
    PrintNodes(out,(ZCC_TreeNode *)node[1].SourceName,true,false);
    PrintNodes(out,*(ZCC_TreeNode **)&node[1].SourceLoc,false,false);
    FLispString::Close(out);
    return;
  }
  __assert_fail("enode->Operation == PEX_FuncCall",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/ast.cpp"
                ,0x212,"void PrintExprFuncCall(FLispString &, ZCC_TreeNode *)");
}

Assistant:

static void PrintExprFuncCall(FLispString &out, ZCC_TreeNode *node)
{
	ZCC_ExprFuncCall *enode = (ZCC_ExprFuncCall *)node;
	assert(enode->Operation == PEX_FuncCall);
	out.Open("expr-func-call");
	PrintNodes(out, enode->Function);
	PrintNodes(out, enode->Parameters, false);
	out.Close();
}